

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  ushort uVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  sqlite3_io_methods *psVar7;
  char **ppcVar8;
  char *pcVar9;
  size_t sVar10;
  unixShmNode *puVar11;
  uint *puVar12;
  sqlite3_mutex *psVar13;
  u64 n;
  ulong uVar14;
  undefined8 uVar15;
  long lVar16;
  unixShmNode *zBuf;
  char *pcVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  stat sStat;
  int local_108;
  int local_ec;
  int local_c4;
  undefined1 local_c0 [24];
  uint local_a8;
  uint local_a4;
  undefined4 local_a0;
  long local_90;
  
  uVar4 = (*aSyscall[0x19].pCurrent)();
  uVar20 = 1;
  if (0x7fff < (int)uVar4) {
    uVar20 = uVar4 >> 0xf;
  }
  psVar7 = fd[8].pMethods;
  if (psVar7 == (sqlite3_io_methods *)0x0) {
    iVar19 = sqlite3_initialize();
    if (iVar19 != 0) {
      return 7;
    }
    psVar7 = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    if (psVar7 == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    *(undefined8 *)psVar7 = 0;
    psVar7->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    psVar7->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    psVar2 = fd[2].pMethods;
    puVar11 = (unixShmNode *)psVar2->xLock;
    local_ec = 0;
    if (puVar11 == (unixShmNode *)0x0) {
      psVar3 = fd[7].pMethods;
      iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
      iVar19 = 0x70a;
      if (iVar5 == 0) {
        sVar10 = strlen((char *)psVar3);
        iVar5 = sqlite3_initialize();
        iVar19 = 7;
        if (iVar5 == 0) {
          local_108 = (int)sVar10;
          puVar11 = (unixShmNode *)sqlite3Malloc((long)local_108 + 0x66U);
          if (puVar11 != (unixShmNode *)0x0) {
            local_ec = 0;
            memset(puVar11,0,(long)local_108 + 0x66U);
            zBuf = puVar11 + 1;
            puVar11->zFilename = (char *)zBuf;
            sqlite3_snprintf(local_108 + 6,(char *)zBuf,"%s-shm",psVar3);
            puVar11->hShm = -1;
            psVar3 = fd[2].pMethods;
            psVar3->xLock = (_func_int_sqlite3_file_ptr_int *)puVar11;
            puVar11->pInode = (unixInodeInfo *)psVar3;
            if (sqlite3Config.bCoreMutex == '\0') {
LAB_00127909:
              if (*(char *)((long)&psVar2->xTruncate + 1) != '\0') goto LAB_001275a7;
              iVar19 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
              if (iVar19 == 0) {
                uVar4 = robust_open((char *)zBuf,0x20042,local_a8 & 0x1ff);
                puVar11->hShm = uVar4;
              }
              else {
                uVar4 = puVar11->hShm;
              }
              if ((int)uVar4 < 0) {
                uVar4 = robust_open((char *)zBuf,0x20000,local_a8 & 0x1ff);
                puVar11->hShm = uVar4;
                if ((int)uVar4 < 0) {
                  sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x9ccc,
                              "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                  unixLogErrorAtLine(0xe,"open",(char *)zBuf,0x9ccc);
                  iVar19 = 0xe;
                  goto LAB_0012777f;
                }
                puVar11->isReadonly = '\x01';
              }
              iVar19 = (*aSyscall[0x15].pCurrent)();
              if (iVar19 == 0) {
                (*aSyscall[0x14].pCurrent)((ulong)uVar4,(ulong)local_a4,local_a0);
              }
              local_ec = unixLockSharedMemory((unixFile *)fd,puVar11);
              if ((local_ec == 0x508) || (iVar19 = local_ec, local_ec == 0)) goto LAB_001275a7;
            }
            else {
              iVar5 = sqlite3_initialize();
              if (iVar5 == 0) {
                psVar13 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                puVar11->pShmMutex = psVar13;
                if (psVar13 != (sqlite3_mutex *)0x0) goto LAB_00127909;
              }
              else {
                puVar11->pShmMutex = (sqlite3_mutex *)0x0;
              }
            }
          }
        }
      }
LAB_0012777f:
      unixShmPurge((unixFile *)fd);
      sqlite3_free(psVar7);
      psVar13 = unixBigLock;
      goto LAB_0012761c;
    }
LAB_001275a7:
    *(unixShmNode **)psVar7 = puVar11;
    puVar11->nRef = puVar11->nRef + 1;
    fd[8].pMethods = psVar7;
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
    }
    if (puVar11->pShmMutex == (sqlite3_mutex *)0x0) {
      psVar7->xClose = (_func_int_sqlite3_file_ptr *)puVar11->pFirst;
      puVar11->pFirst = (unixShm *)psVar7;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(puVar11->pShmMutex);
      psVar13 = puVar11->pShmMutex;
      psVar7->xClose = (_func_int_sqlite3_file_ptr *)puVar11->pFirst;
      puVar11->pFirst = (unixShm *)psVar7;
      if (psVar13 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar13);
      }
    }
    if (local_ec != 0) {
      return local_ec;
    }
    psVar7 = fd[8].pMethods;
  }
  puVar11 = *(unixShmNode **)psVar7;
  if (puVar11->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(puVar11->pShmMutex);
  }
  if (puVar11->isUnlocked == '\0') {
LAB_00127426:
    iVar19 = (uVar20 + iRegion) - (int)(uVar20 + iRegion) % (int)uVar20;
    iVar5 = 0;
    if ((int)(uint)puVar11->nRegion < iVar19) {
      puVar11->szRegion = szRegion;
      if (-1 < puVar11->hShm) {
        iVar6 = (*aSyscall[5].pCurrent)((ulong)(uint)puVar11->hShm,local_c0);
        iVar5 = 0x130a;
        if (iVar6 != 0) goto LAB_00127528;
        iVar5 = iVar19 * szRegion;
        if (local_90 < iVar5) {
          if (bExtend == 0) {
            iVar5 = 0;
            goto LAB_00127528;
          }
          lVar16 = local_90 + 0xfff;
          if (-1 < local_90) {
            lVar16 = local_90;
          }
          iVar6 = iVar5 + 0xfff;
          if (-1 < iVar5) {
            iVar6 = iVar5;
          }
          iVar5 = (int)(lVar16 >> 0xc);
          if (iVar5 < iVar6 >> 0xc) {
            lVar16 = (long)(iVar6 >> 0xc) - (long)iVar5;
            uVar18 = (long)iVar5 << 0xc | 0xfff;
            do {
              iVar5 = seekAndWriteFd(puVar11->hShm,uVar18,"",1,&local_c4);
              if (iVar5 != 1) {
                pcVar9 = puVar11->zFilename;
                puVar12 = (uint *)__errno_location();
                uVar20 = *puVar12;
                if (pcVar9 == (char *)0x0) {
                  pcVar9 = "";
                }
                pcVar17 = "write";
                iVar5 = 0x130a;
                iVar19 = 0x130a;
                uVar15 = 0x9d5c;
                goto LAB_001278e8;
              }
              uVar18 = uVar18 + 0x1000;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
        }
      }
      ppcVar8 = puVar11->apRegion;
      iVar6 = sqlite3_initialize();
      iVar5 = 0xc0a;
      if (iVar6 == 0) {
        uVar4 = iVar19 * 8;
        if (iVar19 * 8 < 1) {
          uVar4 = 0;
        }
        ppcVar8 = (char **)sqlite3Realloc(ppcVar8,(ulong)uVar4);
        if (ppcVar8 != (char **)0x0) {
          puVar11->apRegion = ppcVar8;
          uVar18 = (ulong)puVar11->nRegion;
          iVar5 = 0;
          if ((int)(uint)puVar11->nRegion < iVar19) {
            n = (u64)(int)(uVar20 * szRegion);
            do {
              if (-1 < puVar11->hShm) {
                pcVar9 = (char *)(*aSyscall[0x16].pCurrent)
                                           (0,n,(ulong)((uint)(puVar11->isReadonly == '\0') * 2 + 1)
                                            ,1,(ulong)(uint)puVar11->hShm,
                                            (uVar18 & 0xffff) * (long)szRegion);
                if (pcVar9 != (char *)0xffffffffffffffff) goto LAB_00127708;
                pcVar9 = puVar11->zFilename;
                puVar12 = (uint *)__errno_location();
                uVar20 = *puVar12;
                if (pcVar9 == (char *)0x0) {
                  pcVar9 = "";
                }
                pcVar17 = "mmap";
                iVar5 = 0x150a;
                iVar19 = 0x150a;
                uVar15 = 0x9d77;
LAB_001278e8:
                sqlite3_log(iVar19,"os_unix.c:%d: (%d) %s(%s) - %s",uVar15,(ulong)uVar20,pcVar17,
                            pcVar9,"");
                break;
              }
              iVar6 = sqlite3_initialize();
              iVar5 = 7;
              if ((iVar6 != 0) || (pcVar9 = (char *)sqlite3Malloc(n), pcVar9 == (char *)0x0)) break;
              memset(pcVar9,0,n);
LAB_00127708:
              uVar1 = puVar11->nRegion;
              uVar14 = (ulong)uVar1;
              uVar18 = (ulong)uVar20;
              if (uVar20 != 0) {
                do {
                  puVar11->apRegion[uVar14] = pcVar9;
                  uVar14 = uVar14 + 1;
                  pcVar9 = pcVar9 + szRegion;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              uVar4 = uVar1 + uVar20;
              uVar18 = (ulong)uVar4;
              puVar11->nRegion = (u16)uVar4;
              iVar5 = 0;
            } while ((int)(uVar4 & 0xffff) < iVar19);
          }
        }
      }
    }
  }
  else {
    iVar5 = unixLockSharedMemory((unixFile *)fd,puVar11);
    if (iVar5 == 0) {
      puVar11->isUnlocked = '\0';
      goto LAB_00127426;
    }
  }
LAB_00127528:
  if (iRegion < (int)(uint)puVar11->nRegion) {
    pcVar9 = puVar11->apRegion[iRegion];
  }
  else {
    pcVar9 = (char *)0x0;
  }
  *pp = pcVar9;
  iVar19 = 8;
  if (puVar11->isReadonly == '\0') {
    iVar19 = iVar5;
  }
  if (iVar5 != 0) {
    iVar19 = iVar5;
  }
  psVar13 = puVar11->pShmMutex;
LAB_0012761c:
  if (psVar13 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar13);
  }
  return iVar19;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( pShmNode->isUnlocked ){
    rc = unixLockSharedMemory(pDbFd, pShmNode);
    if( rc!=SQLITE_OK ) goto shmpage_out;
    pShmNode->isUnlocked = 0;
  }
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->hShm>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->hShm, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }

      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->hShm, iPg*pgsz + pgsz-1,"",1,&x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->hShm>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE,
            MAP_SHARED, pShmNode->hShm, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(nMap);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, nMap);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  return rc;
}